

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O2

int envy_bios_parse_cinema(envy_bios *bios)

{
  uint8_t *res;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  char *__format;
  long lVar8;
  
  uVar2 = (bios->cinema).offset;
  iVar7 = 0;
  if (uVar2 != 0) {
    uVar3 = bios_u8(bios,(uint)uVar2,&(bios->cinema).version);
    res = &(bios->cinema).hlen;
    uVar4 = bios_u8(bios,(bios->cinema).offset + 1,res);
    uVar4 = uVar4 | uVar3;
    for (lVar8 = 0x1cd; lVar8 != 0x1d7; lVar8 = lVar8 + 1) {
      uVar3 = bios_u8(bios,((int)lVar8 + (uint)(bios->cinema).offset) - 0x1cb,
                      (uint8_t *)((long)&bios->data + lVar8));
      uVar4 = uVar4 | uVar3;
    }
    if (uVar4 == 0) {
      envy_bios_block(bios,(uint)(bios->cinema).offset,(uint)(bios->cinema).hlen,"CINEMA",-1);
      bVar1 = (bios->cinema).version;
      if ((bVar1 - 0x30 < 0x11) && ((0x10003U >> (bVar1 - 0x30 & 0x1f) & 1) != 0)) {
        bVar1 = *res;
        uVar6 = (ulong)bVar1;
        if (0xb < bVar1) {
          if (bVar1 != 0xc) {
            fprintf(_stderr,"CINEMA table header longer than expected [%d > %d]\n",uVar6,0xc);
          }
          (bios->cinema).valid = '\x01';
          return 0;
        }
        __format = "CINEMA table header too short [%d < %d]\n";
        uVar5 = 0xc;
      }
      else {
        uVar6 = (ulong)(bVar1 >> 4);
        uVar5 = (ulong)(bVar1 & 0xf);
        __format = "Unknown CINEMA table version %d.%d\n";
      }
      fprintf(_stderr,__format,uVar6,uVar5);
      iVar7 = -0x16;
    }
    else {
      iVar7 = -0xe;
    }
  }
  return iVar7;
}

Assistant:

int envy_bios_parse_cinema (struct envy_bios *bios) {
	struct envy_bios_cinema *cinema = &bios->cinema;
	if (!cinema->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, cinema->offset, &cinema->version);
	err |= bios_u8(bios, cinema->offset+1, &cinema->hlen);
	int i;
	for (i = 0; i < 10; i++)
		err |= bios_u8(bios, cinema->offset+2+i, &cinema->unk02[i]);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, cinema->offset, cinema->hlen, "CINEMA", -1);
	int wanthlen = 0;
	switch (cinema->version) {
		case 0x30:
		case 0x31:
		case 0x40:
			wanthlen = 12;
			break;
		default:
			ENVY_BIOS_ERR("Unknown CINEMA table version %d.%d\n", cinema->version >> 4, cinema->version & 0xf);
			return -EINVAL;
	}
	if (cinema->hlen < wanthlen) {
		ENVY_BIOS_ERR("CINEMA table header too short [%d < %d]\n", cinema->hlen, wanthlen);
		return -EINVAL;
	}
	if (cinema->hlen > wanthlen) {
		ENVY_BIOS_WARN("CINEMA table header longer than expected [%d > %d]\n", cinema->hlen, wanthlen);
	}
	cinema->valid = 1;
	return 0;
}